

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackIFWGenerator::WriteGeneratedByToStrim(cmCPackIFWGenerator *this,cmGeneratedFileStream *xout)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_52;
  cmTimestamp local_51;
  string local_50;
  string local_30;
  
  poVar2 = std::operator<<((ostream *)xout,"<!-- Generated by CPack ");
  poVar2 = std::operator<<(poVar2,"3.5.1");
  poVar2 = std::operator<<(poVar2," IFW generator ");
  std::operator<<(poVar2,"for QtIFW ");
  bVar1 = IsVersionLess(this,"2.0");
  if (bVar1) {
    std::operator<<((ostream *)xout,"less 2.0");
  }
  else {
    std::operator<<((ostream *)xout,(string *)&this->FrameworkVersion);
  }
  poVar2 = std::operator<<((ostream *)xout," tools at ");
  std::__cxx11::string::string((string *)&local_30,"",&local_52);
  cmTimestamp::CurrentTime(&local_50,&local_51,&local_30,true);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2," -->");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmCPackIFWGenerator::WriteGeneratedByToStrim(cmGeneratedFileStream &xout)
{
  xout << "<!-- Generated by CPack " << CMake_VERSION << " IFW generator "
       << "for QtIFW ";
  if(IsVersionLess("2.0"))
    {
    xout << "less 2.0";
    }
  else
    {
    xout << FrameworkVersion;
    }
  xout << " tools at " << cmTimestamp().CurrentTime("", true) << " -->"
       << std::endl;
}